

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_MixedSyntaxAndEdition_Test::
~ParseEditionsTest_MixedSyntaxAndEdition_Test(ParseEditionsTest_MixedSyntaxAndEdition_Test *this)

{
  ParseEditionsTest_MixedSyntaxAndEdition_Test *this_local;
  
  ~ParseEditionsTest_MixedSyntaxAndEdition_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, MixedSyntaxAndEdition) {
  ExpectHasErrors(
      R"schema(
        syntax = "proto2";
        edition = "2023";
        message A {
          optional int32 b = 1;
        })schema",
      "2:8: Expected top-level statement (e.g. \"message\").\n");
}